

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  int *piVar5;
  uint64_t uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int error;
  int result;
  uint64_t base;
  timeval tv;
  long microseconds;
  long seconds;
  fd_set *__arr;
  int local_a0;
  uint __i;
  int count;
  int fd;
  fd_set fds;
  double *timeout_local;
  
  fds.__fds_bits[0xf] = (__fd_mask)timeout;
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  local_a0 = iVar1 + 1;
  if (iVar1 < _glfw.linjs.inotify) {
    local_a0 = _glfw.linjs.inotify + 1;
  }
  do {
    while( true ) {
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        (&count + (ulong)__arr._4_4_ * 2)[0] = 0;
        (&count + (ulong)__arr._4_4_ * 2)[1] = 0;
      }
      *(ulong *)(&count + (long)(iVar1 / 0x40) * 2) =
           1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | *(ulong *)(&count + (long)(iVar1 / 0x40) * 2)
      ;
      if (0 < _glfw.linjs.inotify) {
        *(ulong *)(&count + (long)(_glfw.linjs.inotify / 0x40) * 2) =
             1L << ((byte)((long)_glfw.linjs.inotify % 0x40) & 0x3f) |
             *(ulong *)(&count + (long)(_glfw.linjs.inotify / 0x40) * 2);
      }
      if (fds.__fds_bits[0xf] != 0) break;
      iVar3 = select(local_a0,(fd_set *)&count,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if ((iVar3 != -1) || (piVar5 = __errno_location(), *piVar5 != 4)) {
        return 1;
      }
    }
    base = (uint64_t)*(double *)fds.__fds_bits[0xf];
    tv.tv_sec = (__time_t)((*(double *)fds.__fds_bits[0xf] - (double)(long)base) * 1000000.0);
    tv.tv_usec = tv.tv_sec;
    uVar4 = _glfwPlatformGetTimerValue();
    iVar2 = select(local_a0,(fd_set *)&count,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&base);
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    uVar6 = _glfwPlatformGetTimerValue();
    lVar7 = uVar6 - uVar4;
    auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = 0x45300000;
    uVar4 = _glfwPlatformGetTimerFrequency();
    auVar9._8_4_ = (int)(uVar4 >> 0x20);
    auVar9._0_8_ = uVar4;
    auVar9._12_4_ = 0x45300000;
    *(double *)fds.__fds_bits[0xf] =
         *(double *)fds.__fds_bits[0xf] -
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    if (0 < iVar2) {
      return 1;
    }
  } while (((iVar2 != -1) || (iVar3 != 4)) && (0.0 < *(double *)fds.__fds_bits[0xf]));
  return 0;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}